

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int CVmObjFile::s_getp_deleteFile(vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  CVmNetFile *this;
  int *access_00;
  int access;
  vm_rcdesc rc;
  
  if ((s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc), iVar1 != 0)) {
    s_getp_deleteFile::desc.min_argc_ = 1;
    s_getp_deleteFile::desc.opt_argc_ = 0;
    s_getp_deleteFile::desc.varargs_ = 0;
    __cxa_guard_release(&s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&s_getp_deleteFile::desc);
  if (iVar1 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"File.deleteFile");
    access_00 = &access;
    access = 0x1000;
    this = get_filename_and_access(&rc,access_00,0,0xb,"application/octet-stream");
    CVmNetFile::close(this,(int)access_00);
    sp_ = sp_ + -1;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_deleteFile(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the filename; use the DELETE access mode */
    vm_rcdesc rc(vmg_ "File.deleteFile",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_DELETE_FILE, G_stk->get(0), argc);
    int access = VMOBJFILE_ACCESS_DELETE;
    CVmNetFile *netfile = get_filename_and_access(
        vmg_ &rc, &access, FALSE, OSFTUNK, "application/octet-stream");

    /* close the network file descriptor - this will delete the file */
    netfile->close(vmg0_);

    /* discard arguments */
    G_stk->discard(1);

    /* no return */
    retval->set_nil();

    /* handled */
    return TRUE;
}